

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O1

void __thiscall muduo::ThreadPool::ThreadPool(ThreadPool *this,string *nameArg)

{
  MutexLock *__mutex;
  pointer pcVar1;
  
  __mutex = &this->mutex_;
  (this->mutex_).holder_ = 0;
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  (this->notEmpty_).mutex_ = __mutex;
  pthread_cond_init((pthread_cond_t *)&(this->notEmpty_).pcond_,(pthread_condattr_t *)0x0);
  (this->notFull_).mutex_ = __mutex;
  pthread_cond_init((pthread_cond_t *)&(this->notFull_).pcond_,(pthread_condattr_t *)0x0);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + nameArg->_M_string_length);
  memset(&this->threadInitCallback_,0,0x88);
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->queue_).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  this->maxQueueSize_ = 0;
  this->running_ = false;
  return;
}

Assistant:

ThreadPool::ThreadPool(const string& nameArg)
  : mutex_(),
    notEmpty_(mutex_),
    notFull_(mutex_),
    name_(nameArg),
    maxQueueSize_(0),
    running_(false)
{
}